

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

int libtorrent::anon_unknown_1::load_file
              (string *filename,vector<char,_std::allocator<char>_> *v,error_code *ec,
              int max_buffer_size)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  FILE *pFVar4;
  int *piVar5;
  error_category *peVar6;
  size_type __new_size;
  size_type __n;
  size_t __new_size_00;
  size_t read;
  int64_t s;
  file_pointer local_38;
  file_pointer f;
  int max_buffer_size_local;
  error_code *ec_local;
  vector<char,_std::allocator<char>_> *v_local;
  string *filename_local;
  
  f.ptr._4_4_ = max_buffer_size;
  boost::system::error_code::clear(ec);
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  pFVar3 = fopen64(pcVar2,"rb");
  libtorrent::aux::file_pointer::file_pointer(&local_38,(FILE *)pFVar3);
  pFVar4 = libtorrent::aux::file_pointer::file(&local_38);
  if (pFVar4 == (FILE *)0x0) {
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    peVar6 = boost::system::generic_category();
    boost::system::error_code::assign(ec,iVar1,peVar6);
    filename_local._4_4_ = -1;
  }
  else {
    pFVar3 = (FILE *)libtorrent::aux::file_pointer::file(&local_38);
    iVar1 = fseek(pFVar3,0,2);
    if (iVar1 < 0) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      peVar6 = boost::system::generic_category();
      boost::system::error_code::assign(ec,iVar1,peVar6);
      filename_local._4_4_ = -1;
    }
    else {
      pFVar3 = (FILE *)libtorrent::aux::file_pointer::file(&local_38);
      __new_size = ftell(pFVar3);
      if ((long)__new_size < 0) {
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        peVar6 = boost::system::generic_category();
        boost::system::error_code::assign(ec,iVar1,peVar6);
        filename_local._4_4_ = -1;
      }
      else if ((long)f.ptr._4_4_ < (long)__new_size) {
        boost::system::error_code::operator=(ec,metadata_too_large);
        filename_local._4_4_ = -1;
      }
      else {
        pFVar3 = (FILE *)libtorrent::aux::file_pointer::file(&local_38);
        iVar1 = fseek(pFVar3,0,0);
        if (iVar1 < 0) {
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          peVar6 = boost::system::generic_category();
          boost::system::error_code::assign(ec,iVar1,peVar6);
          filename_local._4_4_ = -1;
        }
        else {
          ::std::vector<char,_std::allocator<char>_>::resize(v,__new_size);
          if (__new_size == 0) {
            filename_local._4_4_ = 0;
          }
          else {
            pcVar2 = ::std::vector<char,_std::allocator<char>_>::data(v);
            __n = ::std::vector<char,_std::allocator<char>_>::size(v);
            pFVar3 = (FILE *)libtorrent::aux::file_pointer::file(&local_38);
            __new_size_00 = fread(pcVar2,1,__n,pFVar3);
            if (__new_size_00 == __new_size) {
              filename_local._4_4_ = 0;
            }
            else {
              pFVar3 = (FILE *)libtorrent::aux::file_pointer::file(&local_38);
              iVar1 = feof(pFVar3);
              if (iVar1 == 0) {
                piVar5 = __errno_location();
                iVar1 = *piVar5;
                peVar6 = boost::system::generic_category();
                boost::system::error_code::assign(ec,iVar1,peVar6);
                filename_local._4_4_ = -1;
              }
              else {
                ::std::vector<char,_std::allocator<char>_>::resize(v,__new_size_00);
                filename_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  libtorrent::aux::file_pointer::~file_pointer(&local_38);
  return filename_local._4_4_;
}

Assistant:

int load_file(std::string const& filename, std::vector<char>& v
		, error_code& ec, int const max_buffer_size = 80000000)
	{
		ec.clear();
#ifdef TORRENT_WINDOWS
		aux::file_pointer f(::_wfopen(convert_to_native_path_string(filename).c_str(), L"rb"));
#else
		aux::file_pointer f(std::fopen(filename.c_str(), "rb"));
#endif
		if (f.file() == nullptr)
		{
			ec.assign(errno, generic_category());
			return -1;
		}

		if (std::fseek(f.file(), 0, SEEK_END) < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		std::int64_t const s = std::ftell(f.file());
		if (s < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		if (s > max_buffer_size)
		{
			ec = errors::metadata_too_large;
			return -1;
		}
		if (std::fseek(f.file(), 0, SEEK_SET) < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		v.resize(std::size_t(s));
		if (s == 0) return 0;
		std::size_t const read = std::fread(v.data(), 1, v.size(), f.file());
		if (read != std::size_t(s))
		{
			if (std::feof(f.file()))
			{
				v.resize(read);
				return 0;
			}
			ec.assign(errno, generic_category());
			return -1;
		}
		return 0;
	}